

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to4_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  int iVar1;
  int in_ECX;
  long lVar2;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  short *k00;
  int j_1;
  int i_2;
  int p_1;
  short *g00;
  int k;
  Mat g0;
  int q;
  int i_1;
  short *tmpp;
  int j;
  int i;
  short tmp [6] [3];
  char *k2;
  char *k1;
  char *k0;
  short *kernel_tm0;
  char *kernel0;
  int q_1;
  int p;
  short ktm [6] [3];
  Mat kernel_tm;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Option *in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa70;
  int in_stack_fffffffffffffa74;
  Mat *in_stack_fffffffffffffa78;
  Allocator *pAVar3;
  Mat *in_stack_fffffffffffffa80;
  size_t in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa90;
  int _c;
  undefined8 in_stack_fffffffffffffa98;
  Mat *in_stack_fffffffffffffaa0;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined4 local_4e0;
  long *local_4d8;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined4 local_4c0;
  undefined8 local_4b8;
  _func_int **local_4b0;
  int local_4a4;
  int local_4a0;
  int local_49c;
  undefined2 *local_498;
  int local_48c;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined4 local_470;
  long local_468;
  undefined4 local_460;
  undefined4 local_45c;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined8 local_448;
  int local_440;
  int local_43c;
  short *local_438;
  int local_430;
  int local_42c;
  short local_428 [20];
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined4 local_3d0;
  long *local_3c8;
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined8 local_3a8;
  _func_int **local_3a0;
  char *local_388;
  int local_380;
  int local_37c;
  short local_378 [24];
  Allocator local_348;
  int *local_340;
  long local_338;
  undefined4 local_330;
  long *local_328;
  undefined4 local_320;
  int local_31c;
  int local_318;
  undefined4 local_314;
  undefined4 local_310;
  long local_308;
  int local_2f8;
  int local_2f4;
  long *local_2f0;
  long *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d0;
  undefined8 *local_2c0;
  Allocator *local_2b0;
  int local_290;
  undefined4 local_28c;
  Allocator *local_288;
  undefined8 *local_268;
  undefined8 *local_248;
  undefined8 *local_228;
  undefined1 local_21d;
  int local_21c;
  Allocator *local_218;
  undefined8 *local_210;
  undefined1 local_1ed;
  int local_1ec;
  undefined8 *local_1e0;
  undefined1 local_1bd;
  int local_1bc;
  Allocator *local_1b8;
  undefined8 *local_1b0;
  _func_int **local_148;
  undefined8 local_138;
  undefined8 local_130;
  int local_124;
  int local_120;
  undefined4 local_11c;
  Allocator *local_118;
  long *local_110;
  undefined4 local_104;
  long local_100;
  _func_int **local_f8;
  undefined4 local_ec;
  int local_e8;
  int local_e4;
  undefined8 *local_e0;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  long local_c0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  long *local_a0;
  undefined4 local_94;
  long local_90;
  _func_int **local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  undefined4 local_64;
  long local_60;
  undefined4 local_54;
  long local_50;
  undefined4 local_44;
  long local_40;
  int local_2c;
  undefined8 *local_28;
  int local_1c;
  undefined8 *local_18;
  int local_c;
  undefined8 *local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffa90 >> 0x20);
  local_2f8 = in_ECX;
  local_2f4 = in_EDX;
  local_2f0 = in_RSI;
  local_2e8 = in_RDI;
  iVar1 = cpu_support_x86_avx2();
  if (iVar1 == 0) {
    iVar1 = cpu_support_x86_xop();
    if (iVar1 == 0) {
      pAVar3 = &local_348;
      local_11c = 0x24;
      local_120 = local_2f4;
      local_124 = local_2f8;
      local_130 = 2;
      local_138 = 0;
      local_348._vptr_Allocator = (_func_int **)0x0;
      local_340 = (int *)0x0;
      local_338 = 0;
      local_330 = 0;
      local_328 = (long *)0x0;
      local_320 = 0;
      local_31c = 0;
      local_318 = 0;
      local_314 = 0;
      local_310 = 0;
      local_308 = 0;
      local_118 = pAVar3;
      Mat::create(in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
                  (int)in_stack_fffffffffffffa98,_c,in_stack_fffffffffffffa88,
                  (Allocator *)in_stack_fffffffffffffa80);
      iVar1 = (int)((ulong)in_stack_fffffffffffffa80 >> 0x20);
      memcpy(local_378,&DAT_01c751e0,0x24);
      for (local_37c = 0; local_37c < local_2f8; local_37c = local_37c + 1) {
        for (local_380 = 0; local_380 < local_2f4; local_380 = local_380 + 1) {
          local_3f0 = (char *)(*local_2e8 + (long)(local_37c * local_2f4 * 9) +
                              (long)(local_380 * 9));
          local_1b0 = &local_3e8;
          local_1b8 = &local_348;
          local_f8 = local_348._vptr_Allocator + local_308 * local_37c * local_338;
          local_e0 = &local_3e8;
          local_40 = (long)local_31c * (long)local_318 * local_338;
          local_3c8 = local_328;
          local_44 = 0x10;
          local_e4 = local_31c;
          local_e8 = local_318;
          local_ec = local_314;
          local_100 = local_338;
          local_104 = local_330;
          local_110 = local_328;
          local_1bc = local_37c;
          local_1bd = 1;
          local_18 = &local_3e8;
          local_1c = local_380;
          local_3a0 = (_func_int **)((long)local_f8 + (long)local_31c * (long)local_380 * local_338)
          ;
          local_2e0 = &local_3e8;
          local_3e8 = 0;
          local_3d8 = 0;
          local_3d0 = 0;
          local_3c0 = 0;
          local_3bc = 0;
          local_3b8 = 0;
          local_3b4 = 0;
          local_3b0 = 0;
          local_3a8 = 0;
          local_3e0 = 0;
          local_3f8 = local_3f0 + 3;
          local_400 = local_3f0 + 6;
          for (local_42c = 0; local_42c < 6; local_42c = local_42c + 1) {
            local_428[(long)local_42c * 3] =
                 (short)*local_3f0 * local_378[(long)local_42c * 3] +
                 (short)local_3f0[1] * local_378[(long)local_42c * 3 + 1] +
                 (short)local_3f0[2] * local_378[(long)local_42c * 3 + 2];
            local_428[(long)local_42c * 3 + 1] =
                 (short)*local_3f8 * local_378[(long)local_42c * 3] +
                 (short)local_3f0[4] * local_378[(long)local_42c * 3 + 1] +
                 (short)local_3f0[5] * local_378[(long)local_42c * 3 + 2];
            local_428[(long)local_42c * 3 + 2] =
                 (short)*local_400 * local_378[(long)local_42c * 3] +
                 (short)local_3f0[7] * local_378[(long)local_42c * 3 + 1] +
                 (short)local_3f0[8] * local_378[(long)local_42c * 3 + 2];
          }
          for (local_430 = 0; local_430 < 6; local_430 = local_430 + 1) {
            lVar2 = (long)local_430;
            local_438 = local_428 + lVar2 * 3;
            for (local_43c = 0; local_43c < 6; local_43c = local_43c + 1) {
              *(short *)((long)local_3a0 + (long)(local_430 * 6 + local_43c) * 2) =
                   *local_438 * local_378[(long)local_43c * 3] +
                   local_428[lVar2 * 3 + 1] * local_378[(long)local_43c * 3 + 1] +
                   local_428[lVar2 * 3 + 2] * local_378[(long)local_43c * 3 + 2];
            }
          }
          local_388 = local_3f0;
          local_228 = local_2e0;
        }
      }
      Mat::create(in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
                  (int)in_stack_fffffffffffffa98,_c,in_stack_fffffffffffffa88,iVar1,pAVar3);
      for (local_440 = 0; local_440 + 3 < local_2f8; local_440 = local_440 + 4) {
        local_1ec = local_440 / 4;
        local_1e0 = &local_488;
        local_ac = *(int *)((long)local_2f0 + 0x2c);
        local_b0 = (int)local_2f0[6];
        local_b4 = *(undefined4 *)((long)local_2f0 + 0x34);
        local_c0 = *local_2f0 + local_2f0[8] * (long)local_1ec * local_2f0[2];
        local_c8 = local_2f0[2];
        local_cc = (undefined4)local_2f0[3];
        local_d8 = local_2f0[4];
        local_a8 = &local_488;
        local_50 = (long)local_ac * (long)local_b0 * local_c8;
        for (local_48c = 0; local_48c < 0x24; local_48c = local_48c + 1) {
          local_28 = &local_488;
          local_2c = local_48c;
          local_498 = (undefined2 *)(local_c0 + (long)local_ac * (long)local_48c * local_c8);
          for (local_49c = 0; local_49c + 7 < local_2f4; local_49c = local_49c + 8) {
            for (local_4a0 = 0; local_4a0 < 4; local_4a0 = local_4a0 + 1) {
              for (local_4a4 = 0; local_4a4 < 8; local_4a4 = local_4a4 + 1) {
                local_21c = local_440 + local_4a0;
                local_210 = &local_4f8;
                local_218 = &local_348;
                local_88 = local_348._vptr_Allocator + local_308 * local_21c * local_338;
                local_70 = &local_4f8;
                local_60 = (long)local_31c * (long)local_318 * local_338;
                local_c = local_49c + local_4a4;
                local_8 = &local_4f8;
                local_4b0 = (_func_int **)
                            ((long)local_88 + (long)local_31c * (long)local_c * local_338);
                local_2d0 = &local_4f8;
                local_4d8 = local_328;
                local_64 = 0x10;
                local_74 = local_31c;
                local_78 = local_318;
                local_7c = local_314;
                local_90 = local_338;
                local_94 = local_330;
                local_a0 = local_328;
                local_21d = 1;
                local_4f8 = 0;
                local_4e8 = 0;
                local_4e0 = 0;
                local_4d0 = 0;
                local_4cc = 0;
                local_4c8 = 0;
                local_4c4 = 0;
                local_4c0 = 0;
                local_4b8 = 0;
                local_4f0 = 0;
                *local_498 = *(undefined2 *)((long)local_4b0 + (long)local_48c * 2);
                local_498 = local_498 + 1;
                local_248 = local_2d0;
              }
            }
          }
        }
        local_2c0 = &local_488;
        local_54 = 0x10;
        local_1ed = 1;
        local_488 = 0;
        local_478 = 0;
        local_470 = 0;
        local_460 = 0;
        local_45c = 0;
        local_458 = 0;
        local_454 = 0;
        local_450 = 0;
        local_448 = 0;
        local_480 = 0;
        local_268 = local_2c0;
        local_468 = local_d8;
      }
      pAVar3 = &local_348;
      if (local_340 != (int *)0x0) {
        local_28c = 0xffffffff;
        LOCK();
        local_290 = *local_340;
        *local_340 = *local_340 + -1;
        UNLOCK();
        if (local_290 == 1) {
          local_2b0 = pAVar3;
          local_288 = pAVar3;
          if (local_328 == (long *)0x0) {
            local_148 = local_348._vptr_Allocator;
            if (local_348._vptr_Allocator != (_func_int **)0x0) {
              free(local_348._vptr_Allocator);
            }
          }
          else {
            (**(code **)(*local_328 + 0x18))(local_328,local_348._vptr_Allocator);
          }
        }
      }
      pAVar3->_vptr_Allocator = (_func_int **)0x0;
      pAVar3[2]._vptr_Allocator = (_func_int **)0x0;
      *(undefined4 *)&pAVar3[3]._vptr_Allocator = 0;
      *(undefined4 *)&pAVar3[5]._vptr_Allocator = 0;
      *(undefined4 *)((long)&pAVar3[5]._vptr_Allocator + 4) = 0;
      *(undefined4 *)&pAVar3[6]._vptr_Allocator = 0;
      *(undefined4 *)((long)&pAVar3[6]._vptr_Allocator + 4) = 0;
      *(undefined4 *)&pAVar3[7]._vptr_Allocator = 0;
      pAVar3[8]._vptr_Allocator = (_func_int **)0x0;
      pAVar3[1]._vptr_Allocator = (_func_int **)0x0;
    }
    else {
      conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
                (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,
                 in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    }
  }
  else {
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2
              (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,
               in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx512vnni(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avxvnni(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif
#endif

    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch, (size_t)2u);

    const short ktm[6][3] = {
        {6, 0, 0},
        {-4, -4, -4},
        {-4, 4, -4},
        {1, 2, 4},
        {1, -2, 4},
        {0, 0, 6}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 4b-8a-inch/8a-36-outch/4b
    kernel_tm_pack8.create(inch / 8, 36, outch / 4, (size_t)2u * 32, 32);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm_pack8.channel(q / 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const short* k00 = kernel_tm.channel(q + i).row<const short>(p + j);
                        g00[0] = k00[k];
                        g00 += 1;
                    }
                }
            }
        }
    }
}